

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dna_bwt_n.hpp
# Opt level: O0

void __thiscall
dna_bwt_n<dna_string_n>::next_leaves
          (dna_bwt_n<dna_string_n> *this,sa_leaf *L,
          vector<sa_leaf,_std::allocator<sa_leaf>_> *TMP_LEAVES,int *t,int min_n_children)

{
  int iVar1;
  sa_leaf L_00;
  sa_leaf L_01;
  sa_leaf L_02;
  sa_leaf L_03;
  sa_leaf L_04;
  range_t rn;
  __normal_iterator<sa_leaf_*,_std::vector<sa_leaf,_std::allocator<sa_leaf>_>_> *this_00;
  uint64_t uVar2;
  iterator iVar3;
  __normal_iterator<sa_leaf_*,_std::vector<sa_leaf,_std::allocator<sa_leaf>_>_> _Var4;
  int *in_RCX;
  vector<sa_leaf,_std::allocator<sa_leaf>_> *in_RDX;
  long in_RSI;
  int in_R8D;
  sa_leaf T;
  sa_leaf N;
  sa_leaf G;
  sa_leaf C;
  sa_leaf A;
  p_range_n ext;
  range_t in_stack_fffffffffffffe60;
  uint64_t in_stack_fffffffffffffe70;
  dna_bwt_n<dna_string_n> *in_stack_ffffffffffffff50;
  unsigned_long in_stack_ffffffffffffff58;
  unsigned_long in_stack_ffffffffffffff60;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  
  *in_RCX = 0;
  rn.second = in_stack_ffffffffffffff60;
  rn.first = in_stack_ffffffffffffff58;
  LF(in_stack_ffffffffffffff50,rn);
  this_00 = (__normal_iterator<sa_leaf_*,_std::vector<sa_leaf,_std::allocator<sa_leaf>_>_> *)
            (*(long *)(in_RSI + 0x10) + 1);
  L_00.depth = in_stack_fffffffffffffe70;
  L_00.rn = in_stack_fffffffffffffe60;
  uVar2 = leaf_size(L_00);
  if ((ulong)(long)in_R8D <= uVar2) {
    iVar1 = *in_RCX;
    *in_RCX = iVar1 + 1;
    std::vector<sa_leaf,_std::allocator<sa_leaf>_>::operator[](in_RDX,(long)iVar1);
    sa_leaf::operator=(local_70,local_78);
  }
  L_01.depth = in_stack_fffffffffffffe70;
  L_01.rn = in_stack_fffffffffffffe60;
  uVar2 = leaf_size(L_01);
  if ((ulong)(long)in_R8D <= uVar2) {
    iVar1 = *in_RCX;
    *in_RCX = iVar1 + 1;
    std::vector<sa_leaf,_std::allocator<sa_leaf>_>::operator[](in_RDX,(long)iVar1);
    sa_leaf::operator=(local_60,local_68);
  }
  L_02.depth = in_stack_fffffffffffffe70;
  L_02.rn = in_stack_fffffffffffffe60;
  uVar2 = leaf_size(L_02);
  if ((ulong)(long)in_R8D <= uVar2) {
    iVar1 = *in_RCX;
    *in_RCX = iVar1 + 1;
    std::vector<sa_leaf,_std::allocator<sa_leaf>_>::operator[](in_RDX,(long)iVar1);
    sa_leaf::operator=(local_50,local_58);
  }
  L_03.depth = in_stack_fffffffffffffe70;
  L_03.rn = in_stack_fffffffffffffe60;
  uVar2 = leaf_size(L_03);
  if ((ulong)(long)in_R8D <= uVar2) {
    iVar1 = *in_RCX;
    *in_RCX = iVar1 + 1;
    std::vector<sa_leaf,_std::allocator<sa_leaf>_>::operator[](in_RDX,(long)iVar1);
    sa_leaf::operator=(local_40,local_48);
  }
  L_04.depth = in_stack_fffffffffffffe70;
  L_04.rn = in_stack_fffffffffffffe60;
  uVar2 = leaf_size(L_04);
  if ((ulong)(long)in_R8D <= uVar2) {
    iVar1 = *in_RCX;
    *in_RCX = iVar1 + 1;
    std::vector<sa_leaf,_std::allocator<sa_leaf>_>::operator[](in_RDX,(long)iVar1);
    sa_leaf::operator=(local_30,local_38);
  }
  iVar3 = std::vector<sa_leaf,_std::allocator<sa_leaf>_>::begin(local_38);
  std::vector<sa_leaf,_std::allocator<sa_leaf>_>::begin
            ((vector<sa_leaf,_std::allocator<sa_leaf>_> *)local_38);
  _Var4 = __gnu_cxx::__normal_iterator<sa_leaf_*,_std::vector<sa_leaf,_std::allocator<sa_leaf>_>_>::
          operator+(this_00,local_30);
  std::
  sort<__gnu_cxx::__normal_iterator<sa_leaf*,std::vector<sa_leaf,std::allocator<sa_leaf>>>,dna_bwt_n<dna_string_n>::next_leaves(sa_leaf&,std::vector<sa_leaf,std::allocator<sa_leaf>>&,int&,int)::_lambda(sa_leaf_const&,sa_leaf_const&)_1_>
            (iVar3._M_current,_Var4._M_current);
  return;
}

Assistant:

void next_leaves(sa_leaf & L, vector<sa_leaf> & TMP_LEAVES, int & t, int min_n_children){

		t = 0;

		p_range_n ext = LF(L.rn);

		sa_leaf A = {ext.A, L.depth+1};
		sa_leaf C = {ext.C, L.depth+1};
		sa_leaf G = {ext.G, L.depth+1};
		sa_leaf N = {ext.N, L.depth+1};
		sa_leaf T = {ext.T, L.depth+1};

		if(leaf_size(A)>=min_n_children) TMP_LEAVES[t++] = A;
		if(leaf_size(C)>=min_n_children) TMP_LEAVES[t++] = C;
		if(leaf_size(G)>=min_n_children) TMP_LEAVES[t++] = G;
		if(leaf_size(N)>=min_n_children) TMP_LEAVES[t++] = N;
		if(leaf_size(T)>=min_n_children) TMP_LEAVES[t++] = T;

		std::sort( TMP_LEAVES.begin(), TMP_LEAVES.begin()+t, [ ]( const sa_leaf& lhs, const sa_leaf& rhs )
		{
			return leaf_size(lhs) < leaf_size(rhs);
		});

	}